

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

void __thiscall
Eigen::IOFormat::IOFormat
          (IOFormat *this,int _precision,int _flags,string *_coeffSeparator,string *_rowSeparator,
          string *_rowPrefix,string *_rowSuffix,string *_matPrefix,string *_matSuffix,char _fill)

{
  ulong uVar1;
  allocator<char> local_55;
  int local_54;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  local_54 = _precision;
  local_38 = _coeffSeparator;
  std::__cxx11::string::string((string *)this,(string *)_matPrefix);
  std::__cxx11::string::string((string *)&this->matSuffix,(string *)_matSuffix);
  local_40 = &this->rowPrefix;
  std::__cxx11::string::string((string *)local_40,(string *)_rowPrefix);
  std::__cxx11::string::string((string *)&this->rowSuffix,(string *)_rowSuffix);
  local_50 = &this->rowSeparator;
  local_48 = &this->rowSuffix;
  std::__cxx11::string::string((string *)local_50,(string *)_rowSeparator);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->rowSpacer,"",&local_55);
  std::__cxx11::string::string((string *)&this->coeffSeparator,(string *)local_38);
  this->fill = _fill;
  this->precision = local_54;
  this->flags = _flags;
  if ((_flags & 1U) == 0) {
    for (uVar1 = (ulong)(uint)(this->matSuffix)._M_string_length;
        (0 < (int)uVar1 && ((this->matSuffix)._M_dataplus._M_p[uVar1 - 1] != '\n'));
        uVar1 = uVar1 - 1) {
      std::__cxx11::string::push_back((char)&this->rowSpacer);
    }
  }
  return;
}

Assistant:

IOFormat(int _precision = StreamPrecision, int _flags = 0,
    const std::string& _coeffSeparator = " ",
    const std::string& _rowSeparator = "\n", const std::string& _rowPrefix="", const std::string& _rowSuffix="",
    const std::string& _matPrefix="", const std::string& _matSuffix="", const char _fill=' ')
  : matPrefix(_matPrefix), matSuffix(_matSuffix), rowPrefix(_rowPrefix), rowSuffix(_rowSuffix), rowSeparator(_rowSeparator),
    rowSpacer(""), coeffSeparator(_coeffSeparator), fill(_fill), precision(_precision), flags(_flags)
  {
    // TODO check if rowPrefix, rowSuffix or rowSeparator contains a newline
    // don't add rowSpacer if columns are not to be aligned
    if((flags & DontAlignCols))
      return;
    int i = int(matSuffix.length())-1;
    while (i>=0 && matSuffix[i]!='\n')
    {
      rowSpacer += ' ';
      i--;
    }
  }